

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_var_thresh_percentile
              (vector_t ***var,float32 **var_thresh,uint32 n_mgau,uint32 n_stream,uint32 n_density,
              uint32 *veclen,float32 percent)

{
  float *pfVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  uint local_70;
  float32 gt;
  uint32 t;
  uint32 b;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 **bin_wdth;
  float32 **max;
  float32 **min;
  uint32 ***histo;
  float32 f;
  float32 percent_local;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_stream_local;
  uint32 n_mgau_local;
  float32 **var_thresh_local;
  vector_t ***var_local;
  
  pvVar3 = __ckd_calloc__((ulong)n_stream,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73b);
  pvVar4 = __ckd_calloc__((ulong)n_stream,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73c);
  pvVar5 = __ckd_calloc__((ulong)n_stream,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x73d);
  for (l = 0; l < n_stream; l = l + 1) {
    pvVar6 = __ckd_calloc__((ulong)veclen[l],8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x740);
    *(void **)((long)pvVar3 + (ulong)l * 8) = pvVar6;
    pvVar6 = __ckd_calloc__((ulong)veclen[l],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x741);
    *(void **)((long)pvVar4 + (ulong)l * 8) = pvVar6;
    pvVar6 = __ckd_calloc__((ulong)veclen[l],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x742);
    *(void **)((long)pvVar5 + (ulong)l * 8) = pvVar6;
    for (t = 0; t < veclen[l]; t = t + 1) {
      pvVar6 = __ckd_calloc__(4000,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                              ,0x744);
      *(void **)(*(long *)((long)pvVar3 + (ulong)l * 8) + (ulong)t * 8) = pvVar6;
      *(undefined4 *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4) = 0x8082ab1e;
      *(undefined4 *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4) = 0x7f7fc99e;
    }
  }
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_stream; l = l + 1) {
      for (b = 0; b < n_density; b = b + 1) {
        for (t = 0; t < veclen[l]; t = t + 1) {
          pfVar1 = (float *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4);
          if (*pfVar1 <= var[k][l][b][t] && var[k][l][b][t] != *pfVar1) {
            *(float *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4) = var[k][l][b][t];
          }
          if ((0.0 < var[k][l][b][t]) &&
             (var[k][l][b][t] < *(float *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4)))
          {
            *(float *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4) = var[k][l][b][t];
          }
        }
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x759,"var_extrema:\n");
  for (l = 0; l < n_stream; l = l + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",(ulong)l);
    for (t = 0; t < veclen[l]; t = t + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t[%.4e %.4e]",
              (double)*(float *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4));
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
  }
  for (l = 0; l < n_stream; l = l + 1) {
    for (t = 0; t < veclen[l]; t = t + 1) {
      *(float *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4) =
           (*(float *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4) -
           *(float *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4)) / 4000.0;
    }
  }
  for (l = 0; l < n_stream; l = l + 1) {
    for (t = 0; t < veclen[l]; t = t + 1) {
      for (k = 0; k < n_mgau; k = k + 1) {
        for (b = 0; b < n_density; b = b + 1) {
          if (0.0 < var[k][l][b][t]) {
            uVar8 = (ulong)l;
            uVar7 = (ulong)t;
            dVar9 = floor((double)((var[k][uVar8][b][uVar7] -
                                   *(float *)(*(long *)((long)pvVar4 + uVar8 * 8) + uVar7 * 4)) /
                                  *(float *)(*(long *)((long)pvVar5 + uVar8 * 8) + uVar7 * 4)));
            lVar2 = *(long *)(*(long *)((long)pvVar3 + (ulong)l * 8) + (ulong)t * 8);
            *(int *)(lVar2 + ((long)dVar9 & 0xffffffffU) * 4) =
                 *(int *)(lVar2 + ((long)dVar9 & 0xffffffffU) * 4) + 1;
          }
        }
      }
    }
  }
  for (l = 0; l < n_stream; l = l + 1) {
    for (t = 0; t < veclen[l]; t = t + 1) {
      local_70 = 0;
      gt = 0.0;
      while (((uint)gt < 4000 &&
             (local_70 = local_70 +
                         *(int *)(*(long *)(*(long *)((long)pvVar3 + (ulong)l * 8) + (ulong)t * 8) +
                                 (ulong)(uint)gt * 4),
             (float)local_70 / (float)(n_mgau * n_density) <= (float)percent / 100.0))) {
        gt = (float32)((int)gt + 1);
      }
      var_thresh[l][t] =
           (float32)((float)((int)gt + 1) *
                     *(float *)(*(long *)((long)pvVar5 + (ulong)l * 8) + (ulong)t * 4) +
                    *(float *)(*(long *)((long)pvVar4 + (ulong)l * 8) + (ulong)t * 4));
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x786,"var_extrema:\n");
  for (l = 0; l < n_stream; l = l + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",(ulong)l);
    for (t = 0; t < veclen[l]; t = t + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t%.4e",(double)(float)var_thresh[l][t]);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
  }
  return 0;
}

Assistant:

int
gauden_var_thresh_percentile(vector_t ***var,
			     float32 **var_thresh,
			     uint32 n_mgau,
			     uint32 n_stream,
			     uint32 n_density,
			     const uint32 *veclen,
			     float32 percent)
{
    float32 f = percent / 100.0;
    uint32 ***histo;
    float32 **min;
    float32 **max;
    float32 **bin_wdth;
    uint32 i, j, k, l, b, t;
    float32 gt;

    histo = (uint32 ***)ckd_calloc(n_stream, sizeof(uint32 **));
    min = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));
    max = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));

    for (j = 0; j < n_stream; j++) {
	histo[j] = ckd_calloc(veclen[j], sizeof(uint32 *));
	min[j] = ckd_calloc(veclen[j], sizeof(float32));
	max[j] = ckd_calloc(veclen[j], sizeof(float32));
	for (l = 0; l < veclen[j]; l++) {
	    histo[j][l] = ckd_calloc(N_BIN, sizeof(uint32));
	    max[j][l] = MIN_NEG_FLOAT32;
	    min[j][l] = MAX_POS_FLOAT32;
	}
    }

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    if (var[i][j][k][l] > max[j][l]) {
			max[j][l] = var[i][j][k][l];
		    }
		    if ((var[i][j][k][l] > 0) && (var[i][j][k][l] < min[j][l])) {
			min[j][l] = var[i][j][k][l];
		    }
		}
	    }
	}
    }

    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t[%.4e %.4e]", min[j][l], max[j][l]);
	}
        E_INFOCONT("\n");
    }

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    max[j][l] = (max[j][l] - min[j][l]) / (float32)N_BIN;
	}
    }

    bin_wdth = max;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] > 0) {
			b = (uint32)floor((var[i][j][k][l] - min[j][l]) / bin_wdth[j][l]);
			++histo[j][l][b];
		    }
		}
	    }
	}
    }

    /* grand total # of variances for each stream */
    gt = n_mgau * n_density;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    t = 0;
	    for (b = 0; b < N_BIN; b++) {
		t += histo[j][l][b];
		if (((float32)t / gt) > f)
		    break;
	    }
	    var_thresh[j][l] = min[j][l] + (b+1) * bin_wdth[j][l];
	}
    }
    
    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t%.4e", var_thresh[j][l]);
	}
        E_INFOCONT("\n");
    }

    return S3_SUCCESS;
}